

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::on_dht_announce(session_impl *this,error_code *e)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  element_type *this_00;
  size_t sVar5;
  torrent *this_01;
  byte local_75;
  shared_ptr<libtorrent::aux::torrent> local_58;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  error_code *e_local;
  session_impl *this_local;
  
  bVar2 = boost::system::error_code::operator_cast_to_bool(e);
  if (bVar2) {
    bVar2 = should_log(this);
    if (bVar2) {
      uVar3 = boost::system::error_code::value(e);
      boost::system::error_code::message_abi_cxx11_
                ((string *)
                 &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,e);
      uVar4 = ::std::__cxx11::string::c_str();
      session_log(this,"aborting DHT announce timer (%d): %s",(ulong)uVar3,uVar4);
      ::std::__cxx11::string::~string
                ((string *)
                 &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else if ((this->m_abort & 1U) == 0) {
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
    if (bVar2) {
      update_dht_announce_interval(this);
      bVar2 = ::std::
              deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
              ::empty(&this->m_dht_torrents);
      if (!bVar2) {
        ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)local_48);
        do {
          ::std::
          deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
          ::front(&this->m_dht_torrents);
          ::std::weak_ptr<libtorrent::aux::torrent>::lock
                    ((weak_ptr<libtorrent::aux::torrent> *)&local_58);
          ::std::shared_ptr<libtorrent::aux::torrent>::operator=
                    ((shared_ptr<libtorrent::aux::torrent> *)local_48,&local_58);
          ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr(&local_58);
          ::std::
          deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
          ::pop_front(&this->m_dht_torrents);
          bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
          local_75 = 0;
          if (!bVar2) {
            bVar2 = ::std::
                    deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
                    ::empty(&this->m_dht_torrents);
            local_75 = bVar2 ^ 0xff;
          }
        } while ((local_75 & 1) != 0);
        bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
        if (bVar2) {
          this_00 = ::std::
                    __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_48);
          torrent::dht_announce(this_00);
        }
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)local_48);
        if (bVar2) {
          return;
        }
      }
      bVar2 = torrent_list<libtorrent::aux::torrent>::empty(&this->m_torrents);
      if (!bVar2) {
        uVar1 = this->m_next_dht_torrent;
        sVar5 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
        if (sVar5 <= uVar1) {
          this->m_next_dht_torrent = 0;
        }
        this_01 = torrent_list<libtorrent::aux::torrent>::operator[]
                            (&this->m_torrents,this->m_next_dht_torrent);
        torrent::dht_announce(this_01);
        this->m_next_dht_torrent = this->m_next_dht_torrent + 1;
        uVar1 = this->m_next_dht_torrent;
        sVar5 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
        if (sVar5 <= uVar1) {
          this->m_next_dht_torrent = 0;
        }
      }
    }
    else {
      ::std::
      deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
      ::clear(&this->m_dht_torrents);
    }
  }
  else {
    session_log(this,"aborting DHT announce timer: m_abort set");
  }
  return;
}

Assistant:

void session_impl::on_dht_announce(error_code const& e)
	{
		COMPLETE_ASYNC("session_impl::on_dht_announce");
		TORRENT_ASSERT(is_single_thread());
		if (e)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("aborting DHT announce timer (%d): %s"
					, e.value(), e.message().c_str());
			}
#endif
			return;
		}

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("aborting DHT announce timer: m_abort set");
#endif
			return;
		}

		if (!m_dht)
		{
			m_dht_torrents.clear();
			return;
		}

		TORRENT_ASSERT(m_dht);

		update_dht_announce_interval();

		if (!m_dht_torrents.empty())
		{
			std::shared_ptr<torrent> t;
			do
			{
				t = m_dht_torrents.front().lock();
				m_dht_torrents.pop_front();
			} while (!t && !m_dht_torrents.empty());

			if (t)
			{
				t->dht_announce();
				return;
			}
		}
		if (m_torrents.empty()) return;

		if (m_next_dht_torrent >= m_torrents.size())
			m_next_dht_torrent = 0;
		m_torrents[m_next_dht_torrent]->dht_announce();
		// TODO: 2 make a list for torrents that want to be announced on the DHT so we
		// don't have to loop over all torrents, just to find the ones that want to announce
		++m_next_dht_torrent;
		if (m_next_dht_torrent >= m_torrents.size())
			m_next_dht_torrent = 0;
	}